

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O1

string * __thiscall
wabt::cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
          (string *__return_storage_ptr__,wabt *this,char (*args) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [4])

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
            ((char (*) [6])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [10])args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
             (char (*) [4])args_3);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
            (__return_storage_ptr__,(char (*) [6])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [10])args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2,
             (char (*) [4])args_3);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}